

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O3

MethodHandle * __thiscall
jsonrpccxx::methodHandle<SomeClass,int,int,int>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,offset_in_SomeClass_to_subr method,
          SomeClass *instance)

{
  function<int_(int,_int)> *method_00;
  _Any_data _Stack_68;
  _Manager_type local_58;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(SomeClass **)local_48._M_unused._0_8_ = instance;
  *(jsonrpccxx **)((long)local_48._M_unused._0_8_ + 8) = this;
  *(offset_in_SomeClass_to_subr *)((long)local_48._M_unused._0_8_ + 0x10) = method;
  local_30 = std::
             _Function_handler<int_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/include/jsonrpccxx/typemapper.hpp:171:57)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<int_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/include/jsonrpccxx/typemapper.hpp:171:57)>
             ::_M_manager;
  std::function<int_(int,_int)>::function
            ((function<int_(int,_int)> *)&_Stack_68,(function<int_(int,_int)> *)&local_48);
  methodHandle<int,int,int>(__return_storage_ptr__,(jsonrpccxx *)_Stack_68._M_pod_data,method_00);
  if (local_58 != (code *)0x0) {
    (*local_58)(&_Stack_68,&_Stack_68,__destroy_functor);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

MethodHandle methodHandle(ReturnType (T::*method)(ParamTypes...), T &instance) {
    std::function<ReturnType(ParamTypes...)> function = [&instance, method](ParamTypes &&... params) -> ReturnType {
      return (instance.*method)(std::forward<ParamTypes>(params)...);
    };
    return methodHandle(function);
  }